

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O0

void bloaty::ReadDWARFDebugInfo
               (InfoReader *reader,Section section,DualMap *symbol_map,RangeSink *sink)

{
  string_view file_range;
  string_view file_range_00;
  string_view name;
  string_view name_00;
  bool bVar1;
  ulong uVar2;
  File *pFVar3;
  string *psVar4;
  CU *cu_00;
  RangeSink *in_RCX;
  string_view sVar5;
  string_view sVar6;
  GeneralDIE die;
  Abbrev *abbrev_1;
  File dwo_dwarf;
  unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> file;
  Abbrev *abbrev;
  DwoFilePointer dwo_info;
  GeneralDIE compileunit_die;
  DIEReader die_reader;
  CU cu;
  CUIter iter;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabf;
  File *in_stack_fffffffffffffac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *in_stack_fffffffffffffad0;
  size_t in_stack_fffffffffffffad8;
  RangeSink *in_stack_fffffffffffffae0;
  CU *in_stack_fffffffffffffae8;
  AbbrevTable *in_stack_fffffffffffffaf0;
  RangeSink *in_stack_fffffffffffffaf8;
  InfoReader *in_stack_fffffffffffffb00;
  RangeSink *this;
  OpenDwarf *in_stack_fffffffffffffb18;
  type in_stack_fffffffffffffb20;
  CU *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  CU *cu_01;
  CU *cu_02;
  RangeSink *in_stack_fffffffffffffb78;
  CU *in_stack_fffffffffffffb80;
  DualMap *in_stack_fffffffffffffb88;
  File *in_stack_fffffffffffffb90;
  byte local_3f8;
  File local_3a0;
  string local_2b0 [8];
  RangeSink *in_stack_fffffffffffffd58;
  DualMap *in_stack_fffffffffffffd60;
  GeneralDIE *in_stack_fffffffffffffd68;
  CU *in_stack_fffffffffffffd70;
  undefined1 local_110 [32];
  RangeSink *local_20;
  
  local_20 = in_RCX;
  dwarf::InfoReader::GetCUIter
            (in_stack_fffffffffffffb00,(Section)((ulong)in_stack_fffffffffffffaf8 >> 0x20),
             (uint64_t)in_stack_fffffffffffffaf0);
  cu_01 = (CU *)&stack0xffffffffffffff10;
  dwarf::CU::CU((CU *)in_stack_fffffffffffffac0);
  cu_02 = (CU *)local_110;
  std::function<void(std::basic_string_view<char,std::char_traits<char>>)>::
  function<bloaty::ReadDWARFDebugInfo(bloaty::dwarf::InfoReader&,bloaty::dwarf::InfoReader::Section,bloaty::DualMap_const&,bloaty::RangeSink*)::__0,void>
            (in_stack_fffffffffffffad0,(anon_class_16_2_e872ee98 *)in_stack_fffffffffffffac8);
  dwarf::CU::SetIndirectStringCallback
            ((CU *)in_stack_fffffffffffffac0,
             (function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)
             CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
  std::function<void_(std::basic_string_view<char,_std::char_traits<char>_>)>::~function
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>)> *)0x20d2ec);
  sVar6._M_str = (char *)in_stack_fffffffffffffad0;
  sVar6._M_len = in_stack_fffffffffffffad8;
  do {
    in_stack_fffffffffffffb37 =
         dwarf::CUIter::NextCU
                   ((CUIter *)cu_01,
                    (InfoReader *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                    in_stack_fffffffffffffb28);
    if (!(bool)in_stack_fffffffffffffb37) {
      dwarf::CU::~CU((CU *)in_stack_fffffffffffffac0);
      return;
    }
    dwarf::CU::GetDIEReader((CU *)sVar6._M_str);
    GeneralDIE::GeneralDIE((GeneralDIE *)in_stack_fffffffffffffac0);
    DwoFilePointer::DwoFilePointer((DwoFilePointer *)in_stack_fffffffffffffac0);
    in_stack_fffffffffffffb28 =
         (CU *)dwarf::DIEReader::ReadCode((DIEReader *)sVar6._M_len,(CU *)sVar6._M_str);
    dwarf::DIEReader::
    ReadAttributes<bloaty::ReadDWARFDebugInfo(bloaty::dwarf::InfoReader&,bloaty::dwarf::InfoReader::Section,bloaty::DualMap_const&,bloaty::RangeSink*)::__1>
              ((DIEReader *)cu_02,cu_01,
               (Abbrev *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               (anon_class_24_3_3189e200 *)in_stack_fffffffffffffb28);
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
      MmapInputFileFactory::MmapInputFileFactory((MmapInputFileFactory *)in_stack_fffffffffffffac0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0);
      std::operator+(in_stack_fffffffffffffac8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffac0);
      MmapInputFileFactory::OpenFile
                ((MmapInputFileFactory *)in_stack_fffffffffffffaf8,
                 (string *)in_stack_fffffffffffffaf0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
      std::__cxx11::string::~string(local_2b0);
      MmapInputFileFactory::~MmapInputFileFactory((MmapInputFileFactory *)0x20d48f);
      dwarf::File::File(in_stack_fffffffffffffac0);
      pFVar3 = dwarf::CU::dwarf((CU *)&stack0xffffffffffffff10);
      in_stack_fffffffffffffb18 = pFVar3->open;
      in_stack_fffffffffffffb20 =
           std::unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>::operator*
                     ((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                      in_stack_fffffffffffffac0);
      (*in_stack_fffffffffffffb18)(in_stack_fffffffffffffb20,&local_3a0,local_20);
      ReadDWARFCompileUnits
                (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78);
      std::unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>::~unique_ptr
                ((unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                 sVar6._M_str);
    }
    dwarf::CU::unit_name_abi_cxx11_((CU *)&stack0xffffffffffffff10);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this = (RangeSink *)&stack0xffffffffffffff10;
      in_stack_fffffffffffffaf8 = local_20;
      psVar4 = dwarf::CU::unit_name_abi_cxx11_((CU *)this);
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      sVar5 = dwarf::CU::entire_unit((CU *)this);
      name._M_str = (char *)in_stack_fffffffffffffb20;
      name._M_len = (size_t)in_stack_fffffffffffffb18;
      file_range._M_str = (char *)sVar5._M_len;
      file_range._M_len = (size_t)sVar5._M_str;
      RangeSink::AddFileRange(this,(char *)in_stack_fffffffffffffaf8,name,file_range);
      AddDIE(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd58);
      bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x20d707);
      if (bVar1) {
        std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x20d71a);
        ReadDWARFStmtListRange
                  (cu_02,(uint64_t)cu_01,
                   (RangeSink *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30));
      }
      in_stack_fffffffffffffae8 = (CU *)&stack0xffffffffffffff10;
      in_stack_fffffffffffffae0 = local_20;
      psVar4 = dwarf::CU::unit_name_abi_cxx11_(in_stack_fffffffffffffae8);
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      in_stack_fffffffffffffaf0 = dwarf::CU::unit_abbrev(in_stack_fffffffffffffae8);
      sVar6 = dwarf::AbbrevTable::abbrev_data(in_stack_fffffffffffffaf0);
      name_00._M_str = (char *)in_stack_fffffffffffffb20;
      name_00._M_len = (size_t)in_stack_fffffffffffffb18;
      file_range_00._M_str = (char *)sVar5._M_len;
      file_range_00._M_len = (size_t)sVar5._M_str;
      RangeSink::AddFileRange(this,(char *)in_stack_fffffffffffffaf8,name_00,file_range_00);
      while (cu_00 = (CU *)dwarf::DIEReader::ReadCode((DIEReader *)sVar6._M_len,(CU *)sVar6._M_str),
            cu_00 != (CU *)0x0) {
        in_stack_fffffffffffffac0 = (File *)&stack0xfffffffffffffb58;
        GeneralDIE::GeneralDIE((GeneralDIE *)in_stack_fffffffffffffac0);
        dwarf::DIEReader::
        ReadAttributes<bloaty::ReadDWARFDebugInfo(bloaty::dwarf::InfoReader&,bloaty::dwarf::InfoReader::Section,bloaty::DualMap_const&,bloaty::RangeSink*)::__2>
                  ((DIEReader *)cu_02,cu_01,
                   (Abbrev *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
                   (anon_class_16_2_74ab3c99 *)in_stack_fffffffffffffb28);
        bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x20d87a);
        if (bVar1) {
          std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x20d88d);
          in_stack_fffffffffffffabf =
               dwarf::CU::IsValidDwarfAddress
                         ((CU *)in_stack_fffffffffffffac0,
                          CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8));
          if ((bool)in_stack_fffffffffffffabf) goto LAB_0020d8ad;
LAB_0020d8b7:
          dwarf::DIEReader::SkipChildren
                    ((DIEReader *)sVar6._M_str,cu_00,(Abbrev *)in_stack_fffffffffffffac0);
        }
        else {
LAB_0020d8ad:
          if ((local_3f8 & 1) != 0) goto LAB_0020d8b7;
          AddDIE(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 in_stack_fffffffffffffd58);
        }
      }
      in_stack_fffffffffffffac8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    DwoFilePointer::~DwoFilePointer((DwoFilePointer *)in_stack_fffffffffffffac0);
  } while( true );
}

Assistant:

static void ReadDWARFDebugInfo(dwarf::InfoReader& reader,
                               dwarf::InfoReader::Section section,
                               const DualMap& symbol_map, RangeSink* sink) {
  dwarf::CUIter iter = reader.GetCUIter(section);
  dwarf::CU cu;
  cu.SetIndirectStringCallback([sink, &cu](string_view str) {
    sink->AddFileRange("dwarf_strp", cu.unit_name(), str);
  });

  while (iter.NextCU(reader, &cu)) {
    dwarf::DIEReader die_reader = cu.GetDIEReader();
    GeneralDIE compileunit_die;
    DwoFilePointer dwo_info;
    auto* abbrev = die_reader.ReadCode(cu);
    die_reader.ReadAttributes(
        cu, abbrev,
        [&](uint16_t tag, dwarf::AttrValue value) {
          ReadGeneralDIEAttr(tag, value, cu, &compileunit_die);
          switch (tag) {
            case DW_AT_comp_dir:
              if (value.IsString()) {
                dwo_info.comp_dir = value.GetString(cu);
              }
              break;
            case DW_AT_GNU_dwo_name:
              if (value.IsString()) {
                dwo_info.dwo_name = value.GetString(cu);
              }
              break;
          }
        });

    if (!dwo_info.comp_dir.empty() && !dwo_info.dwo_name.empty()) {
      auto file = MmapInputFileFactory().OpenFile(dwo_info.comp_dir + "/" + dwo_info.dwo_name);
      dwarf::File dwo_dwarf;
      cu.dwarf().open(*file, &dwo_dwarf, sink);
      ReadDWARFCompileUnits(dwo_dwarf, symbol_map, &cu, sink);
    }

    if (cu.unit_name().empty()) {
      continue;
    }

    sink->AddFileRange("dwarf_debuginfo", cu.unit_name(), cu.entire_unit());
    AddDIE(cu, compileunit_die, symbol_map, sink);

    if (compileunit_die.stmt_list) {
      ReadDWARFStmtListRange(cu, *compileunit_die.stmt_list, sink);
    }

    sink->AddFileRange("dwarf_abbrev", cu.unit_name(), cu.unit_abbrev().abbrev_data());

    while (auto abbrev = die_reader.ReadCode(cu)) {
      GeneralDIE die;
      die_reader.ReadAttributes(
          cu, abbrev, [&cu, &die](uint16_t tag, dwarf::AttrValue value) {
            ReadGeneralDIEAttr(tag, value, cu, &die);
          });

      // low_pc == 0 is a signal that this routine was stripped out of the
      // final binary. Also any declaration should be skipped.
      if ((die.low_pc && !cu.IsValidDwarfAddress(*die.low_pc)) ||
          die.declaration) {
        die_reader.SkipChildren(cu, abbrev);
      } else {
        AddDIE(cu, die, symbol_map, sink);
      }
    }
  }
}